

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numbers.cc
# Opt level: O3

bool __thiscall
absl::numbers_internal::safe_strto8_base
          (numbers_internal *this,string_view text,int8_t *value,int base)

{
  byte bVar1;
  char cVar2;
  char cVar3;
  byte bVar4;
  uint uVar5;
  bool bVar6;
  byte *pbVar7;
  byte *pbVar8;
  long lVar9;
  byte *pbVar10;
  byte *pbVar11;
  
  uVar5 = (uint)value;
  pbVar10 = (byte *)text._M_len;
  *text._M_str = '\0';
  if (pbVar10 == (byte *)0x0) {
    return false;
  }
  pbVar7 = pbVar10;
  if (0 < (long)this) {
    do {
      if (((&ascii_internal::kPropertyBits)[*pbVar7] & 8) == 0) break;
      pbVar7 = pbVar7 + 1;
    } while (pbVar7 < pbVar10 + (long)this);
  }
  do {
    if (pbVar10 + (long)this <= pbVar7) {
      return false;
    }
    pbVar11 = pbVar10 + -1 + (long)this;
    this = this + -1;
  } while (((&ascii_internal::kPropertyBits)[*pbVar11] & 8) != 0);
  bVar1 = *pbVar7;
  pbVar11 = pbVar10 + (long)this + 1;
  if (((bVar1 == 0x2d) || (bVar1 == 0x2b)) && (pbVar7 = pbVar7 + 1, pbVar11 <= pbVar7)) {
    return false;
  }
  if (uVar5 == 0x10) {
    pbVar8 = pbVar10 + (long)this + 1;
    uVar5 = 0x10;
    if (((1 < (long)(pbVar10 + (long)this + (1 - (long)pbVar7))) && (*pbVar7 == 0x30)) &&
       (((pbVar7[1] | 0x20) == 0x78 && (pbVar7 = pbVar7 + 2, pbVar11 <= pbVar7)))) {
      return false;
    }
  }
  else if (uVar5 == 0) {
    pbVar8 = pbVar10 + (long)this + 1;
    if (((long)(pbVar10 + (long)this) - (long)pbVar7) + 1 < 2) {
      uVar5 = 10;
      if ((long)(pbVar10 + (long)this) - (long)pbVar7 == 0) {
        bVar4 = *pbVar7;
        pbVar7 = pbVar7 + (bVar4 == 0x30);
        uVar5 = (uint)(bVar4 != 0x30) * 2 + 8;
      }
    }
    else if (*pbVar7 == 0x30) {
      if ((pbVar7[1] | 0x20) == 0x78) {
        pbVar7 = pbVar7 + 2;
        if (pbVar11 <= pbVar7) {
          return false;
        }
        uVar5 = 0x10;
      }
      else {
        pbVar7 = pbVar7 + 1;
        uVar5 = 8;
      }
    }
    else {
      uVar5 = 10;
    }
  }
  else {
    pbVar8 = pbVar11;
    if (0x22 < uVar5 - 2) {
      return false;
    }
  }
  lVar9 = (long)pbVar8 - (long)pbVar7;
  bVar4 = (byte)uVar5;
  if (bVar1 == 0x2d) {
    if ((uint)(0x80 / bVar4) +
        (int)(char)(anonymous_namespace)::LookupTables<signed_char>::kVminOverBase[uVar5] != 0) {
      __assert_fail("base < 2 || std::numeric_limits<IntType>::min() / base == vmin_over_base",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/build_O3/_deps/abseil-cpp-src/absl/strings/numbers.cc"
                    ,0x404,
                    "bool absl::(anonymous namespace)::safe_parse_negative_int(absl::string_view, int, IntType * _Nonnull) [IntType = signed char]"
                   );
    }
    bVar6 = true;
    if (0 < lVar9) {
      pbVar10 = pbVar7 + lVar9;
      cVar3 = '\0';
      do {
        cVar2 = (anonymous_namespace)::kAsciiToInt[*pbVar7];
        if ((int)uVar5 <= (int)cVar2) goto LAB_001a1319;
        if ((cVar3 < (char)(anonymous_namespace)::LookupTables<signed_char>::kVminOverBase[uVar5])
           || ((int)(char)(cVar3 * bVar4) < cVar2 + -0x80)) {
          bVar6 = false;
          cVar3 = -0x80;
          break;
        }
        cVar3 = cVar3 * bVar4 - cVar2;
        pbVar7 = pbVar7 + 1;
      } while (pbVar7 < pbVar10);
      goto LAB_001a1327;
    }
  }
  else {
    if (0x7f / bVar4 != (anonymous_namespace)::LookupTables<signed_char>::kVmaxOverBase[uVar5]) {
      __assert_fail("base < 2 || std::numeric_limits<IntType>::max() / base_inttype == vmax_over_base"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/build_O3/_deps/abseil-cpp-src/absl/strings/numbers.cc"
                    ,0x3e1,
                    "bool absl::(anonymous namespace)::safe_parse_positive_int(absl::string_view, int, IntType * _Nonnull) [IntType = signed char]"
                   );
    }
    bVar6 = true;
    if (0 < lVar9) {
      pbVar10 = pbVar7 + lVar9;
      cVar3 = '\0';
      do {
        cVar2 = (anonymous_namespace)::kAsciiToInt[*pbVar7];
        if ((int)uVar5 <= (int)cVar2) goto LAB_001a1319;
        if (((char)(anonymous_namespace)::LookupTables<signed_char>::kVmaxOverBase[uVar5] < cVar3)
           || (0x7f - cVar2 < (int)(char)(cVar3 * bVar4))) {
          bVar6 = false;
          cVar3 = '\x7f';
          break;
        }
        cVar3 = cVar2 + cVar3 * bVar4;
        pbVar7 = pbVar7 + 1;
      } while (pbVar7 < pbVar10);
      goto LAB_001a1327;
    }
  }
  bVar6 = true;
  cVar3 = '\0';
LAB_001a1327:
  *text._M_str = cVar3;
  return bVar6;
LAB_001a1319:
  bVar6 = false;
  goto LAB_001a1327;
}

Assistant:

bool safe_strto8_base(absl::string_view text, int8_t* absl_nonnull value,
                      int base) {
  return safe_int_internal<int8_t>(text, value, base);
}